

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpression<const_unsigned_long_&,_(Catch::Internal::Operator)4,_const_unsigned_long_&>
::reconstructExpression
          (BinaryExpression<const_unsigned_long_&,_(Catch::Internal::Operator)4,_const_unsigned_long_&>
           *this,string *dest)

{
  long lVar1;
  unsigned_long in_RDX;
  unsigned_long value;
  string rhs;
  string lhs;
  
  Catch::toString_abi_cxx11_(&lhs,(Catch *)*this->m_lhs,in_RDX);
  Catch::toString_abi_cxx11_(&rhs,(Catch *)*this->m_rhs,value);
  if ((rhs._M_string_length + lhs._M_string_length < 0x28) &&
     (lVar1 = std::__cxx11::string::find((char)&lhs,10), lVar1 == -1)) {
    std::__cxx11::string::find((char)&rhs,10);
  }
  std::__cxx11::string::reserve((ulong)dest);
  std::__cxx11::string::_M_assign((string *)dest);
  std::__cxx11::string::push_back((char)dest);
  std::__cxx11::string::append((char *)dest);
  std::__cxx11::string::push_back((char)dest);
  std::__cxx11::string::append((string *)dest);
  std::__cxx11::string::~string((string *)&rhs);
  std::__cxx11::string::~string((string *)&lhs);
  return;
}

Assistant:

virtual void reconstructExpression( std::string& dest ) const CATCH_OVERRIDE {
        std::string lhs = Catch::toString( m_lhs );
        std::string rhs = Catch::toString( m_rhs );
        char delim = lhs.size() + rhs.size() < 40 &&
                     lhs.find('\n') == std::string::npos &&
                     rhs.find('\n') == std::string::npos ? ' ' : '\n';
        dest.reserve( 7 + lhs.size() + rhs.size() );
                   // 2 for spaces around operator
                   // 2 for operator
                   // 2 for parentheses (conditionally added later)
                   // 1 for negation (conditionally added later)
        dest = lhs;
        dest += delim;
        dest += Internal::OperatorTraits<Op>::getName();
        dest += delim;
        dest += rhs;
    }